

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FANSFixName.c
# Opt level: O2

int FANSFixName_constraint
              (asn_TYPE_descriptor_t *td,void *sptr,asn_app_constraint_failed_f *ctfailcb,
              void *app_key)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 uVar4;
  
  if (sptr == (void *)0x0) {
    if (ctfailcb == (asn_app_constraint_failed_f *)0x0) {
      return -1;
    }
    pcVar3 = td->name;
    uVar4 = 0x20;
    pcVar2 = "%s: value not given (%s:%d)";
    sptr = (void *)0x0;
  }
  else {
    if (*(uint *)((long)sptr + 8) - 1 < 5) {
      pcVar3 = *sptr;
      pcVar2 = pcVar3 + *(uint *)((long)sptr + 8);
      do {
        if (pcVar2 <= pcVar3) {
          return 0;
        }
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (-1 < cVar1);
    }
    if (ctfailcb == (asn_app_constraint_failed_f *)0x0) {
      return -1;
    }
    pcVar3 = td->name;
    uVar4 = 0x2d;
    pcVar2 = "%s: constraint failed (%s:%d)";
  }
  (*ctfailcb)(app_key,td,sptr,pcVar2,pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/FANSFixName.c"
              ,uVar4);
  return -1;
}

Assistant:

int
FANSFixName_constraint(asn_TYPE_descriptor_t *td, const void *sptr,
			asn_app_constraint_failed_f *ctfailcb, void *app_key) {
	const IA5String_t *st = (const IA5String_t *)sptr;
	size_t size;
	
	if(!sptr) {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: value not given (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
	
	size = st->size;
	
	if((size >= 1 && size <= 5)
		 && !check_permitted_alphabet_1(st)) {
		/* Constraint check succeeded */
		return 0;
	} else {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: constraint failed (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
}